

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindowSettings * ImGui::FindOrCreateWindowSettings(char *name)

{
  ImU32 id;
  ImGuiWindowSettings *pIVar1;
  
  id = ImHashStr(name,0,0);
  pIVar1 = FindWindowSettings(id);
  if (pIVar1 != (ImGuiWindowSettings *)0x0) {
    return pIVar1;
  }
  pIVar1 = CreateNewWindowSettings(name);
  return pIVar1;
}

Assistant:

ImGuiWindowSettings* ImGui::FindOrCreateWindowSettings(const char* name)
{
    if (ImGuiWindowSettings* settings = FindWindowSettings(ImHashStr(name)))
        return settings;
    return CreateNewWindowSettings(name);
}